

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O2

VkImageAspectFlags vkt::pipeline::anon_unknown_0::getFormatAspectFlags(VkFormat format)

{
  uint uVar1;
  TextureFormat TVar2;
  
  if (format == VK_FORMAT_UNDEFINED) {
    return 0;
  }
  TVar2 = ::vk::mapVkFormat(format);
  uVar1 = TVar2.order - D;
  if (uVar1 < 3) {
    return uVar1 * 2 + 2;
  }
  return 1;
}

Assistant:

VkImageAspectFlags getFormatAspectFlags (const VkFormat format)
{
	if (format == VK_FORMAT_UNDEFINED)
		return 0;

	const tcu::TextureFormat::ChannelOrder	order	= mapVkFormat(format).order;

	switch (order)
	{
		case tcu::TextureFormat::DS:	return VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT;
		case tcu::TextureFormat::D:		return VK_IMAGE_ASPECT_DEPTH_BIT;
		case tcu::TextureFormat::S:		return VK_IMAGE_ASPECT_STENCIL_BIT;
		default:						return VK_IMAGE_ASPECT_COLOR_BIT;
	}
}